

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlAutomataStatePtr
xmlAutomataNewEpsilon(xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to)

{
  xmlAutomataStatePtr to_local;
  xmlAutomataStatePtr from_local;
  xmlAutomataPtr am_local;
  
  if ((am == (xmlAutomataPtr)0x0) || (from == (xmlAutomataStatePtr)0x0)) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else {
    xmlFAGenerateEpsilonTransition(am,from,to);
    am_local = (xmlAutomataPtr)to;
    if (to == (xmlAutomataStatePtr)0x0) {
      am_local = (xmlAutomataPtr)am->state;
    }
  }
  return (xmlAutomataStatePtr)am_local;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewEpsilon(xmlAutomataPtr am, xmlAutomataStatePtr from,
		      xmlAutomataStatePtr to) {
    if ((am == NULL) || (from == NULL))
	return(NULL);
    xmlFAGenerateEpsilonTransition(am, from, to);
    if (to == NULL)
	return(am->state);
    return(to);
}